

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O2

int kws_search_start(ps_search_t *search)

{
  long lVar1;
  hmm_t *h;
  long lVar2;
  
  *(undefined4 *)&search[1].pls = 0;
  *(undefined4 *)((long)&search[1].config + 4) = 0;
  kws_detections_reset((kws_detections_t *)search[1].name);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)&search[1].dict; lVar1 = lVar1 + 1) {
    h = (hmm_t *)((long)&(search[1].d2p)->refcount + lVar2);
    hmm_clear(h);
    hmm_enter(h,0,-1,0);
    lVar2 = lVar2 + 0x58;
  }
  ptmr_reset((ptmr_t *)&search[1].hyp_str);
  ptmr_start((ptmr_t *)&search[1].hyp_str);
  return 0;
}

Assistant:

int
kws_search_start(ps_search_t * search)
{
    int i;
    kws_search_t *kwss = (kws_search_t *) search;

    kwss->frame = 0;
    kwss->bestscore = 0;
    kws_detections_reset(kwss->detections);

    /* Reset and enter all phone-loop HMMs. */
    for (i = 0; i < kwss->n_pl; ++i) {
        hmm_t *hmm = (hmm_t *) & kwss->pl_hmms[i];
        hmm_clear(hmm);
        hmm_enter(hmm, 0, -1, 0);
    }

    ptmr_reset(&kwss->perf);
    ptmr_start(&kwss->perf);

    return 0;
}